

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  uint uVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  string sStack_70;
  string sStack_50;
  
  sStack_50._M_dataplus._M_p = (pointer)&sStack_50.field_2;
  sStack_50._M_string_length = 0;
  sStack_50.field_2._M_local_buf[0] = '\0';
  _Var5._M_p = (pointer)argc;
  if (1 < *argc) {
    uVar6 = 1;
    do {
      StreamableToString<char*>(&sStack_70,(internal *)(argv + (int)uVar6),in_RDX);
      _Var5._M_p = sStack_70._M_dataplus._M_p;
      bVar1 = ParseGoogleTestFlag(sStack_70._M_dataplus._M_p);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_0019ad70:
        iVar2 = *argc;
        if ((int)(uVar6 + 1) < iVar2) {
          ppcVar3 = argv + (int)(uVar6 + 1);
          in_RDX = (char **)(ulong)(iVar2 - 1U);
          uVar4 = uVar6;
          do {
            argv[(int)uVar4] = *ppcVar3;
            uVar4 = uVar4 + 1;
            ppcVar3 = ppcVar3 + 1;
          } while (iVar2 - 1U != uVar4);
        }
        *argc = iVar2 + -1;
        argv[(long)iVar2 + -1] = (char *)0x0;
        uVar6 = uVar6 - 1;
      }
      else {
        bVar1 = ParseFlag<std::__cxx11::string>(_Var5._M_p,"flagfile",&sStack_50);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
          LoadFlagsFromFile(&sStack_50);
          in_RDX = extraout_RDX_00;
          goto LAB_0019ad70;
        }
        iVar2 = std::__cxx11::string::compare((char *)&sStack_70);
        in_RDX = extraout_RDX_02;
        if ((iVar2 == 0) ||
           (bVar1 = HasGoogleTestFlagPrefix((char *)0x19adf5), in_RDX = extraout_RDX_03, bVar1)) {
          g_help_flag = '\x01';
        }
      }
      _Var5._M_p = sStack_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_70._M_dataplus._M_p != &sStack_70.field_2) {
        operator_delete(sStack_70._M_dataplus._M_p,sStack_70.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_01;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var5._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_50._M_dataplus._M_p != &sStack_50.field_2) {
    operator_delete(sStack_50._M_dataplus._M_p,
                    CONCAT71(sStack_50.field_2._M_allocated_capacity._1_7_,
                             sStack_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
#ifdef GTEST_HAS_ABSL_FLAGS
  if (*argc <= 0) return;

  std::vector<char*> positional_args;
  std::vector<absl::UnrecognizedFlag> unrecognized_flags;
  absl::ParseAbseilFlagsOnly(*argc, argv, positional_args, unrecognized_flags);
  absl::flat_hash_set<absl::string_view> unrecognized;
  for (const auto& flag : unrecognized_flags) {
    unrecognized.insert(flag.flag_name);
  }
  absl::flat_hash_set<char*> positional;
  for (const auto& arg : positional_args) {
    positional.insert(arg);
  }

  int out_pos = 1;
  int in_pos = 1;
  for (; in_pos < *argc; ++in_pos) {
    char* arg = argv[in_pos];
    absl::string_view arg_str(arg);
    if (absl::ConsumePrefix(&arg_str, "--")) {
      // Flag-like argument. If the flag was unrecognized, keep it.
      // If it was a GoogleTest flag, remove it.
      if (unrecognized.contains(arg_str)) {
        argv[out_pos++] = argv[in_pos];
        continue;
      }
    }

    if (arg_str.empty()) {
      ++in_pos;
      break;  // '--' indicates that the rest of the arguments are positional
    }

    // Probably a positional argument. If it is in fact positional, keep it.
    // If it was a value for the flag argument, remove it.
    if (positional.contains(arg)) {
      argv[out_pos++] = arg;
    }
  }

  // The rest are positional args for sure.
  while (in_pos < *argc) {
    argv[out_pos++] = argv[in_pos++];
  }

  *argc = out_pos;
  argv[out_pos] = nullptr;
#else
  ParseGoogleTestFlagsOnlyImpl(argc, argv);
#endif

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#ifdef GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}